

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqtable.cpp
# Opt level: O0

void __thiscall SQTable::Remove(SQTable *this,SQObjectPtr *key)

{
  SQHash SVar1;
  _HashNode *this_00;
  _HashNode *n;
  SQObjectPtr *key_local;
  SQTable *this_local;
  
  SVar1 = HashObj(key);
  this_00 = _Get(this,key,SVar1 & this->_numofnodes - 1U);
  if (this_00 != (_HashNode *)0x0) {
    ::SQObjectPtr::Null(&this_00->val);
    ::SQObjectPtr::Null(&this_00->key);
    this->_usednodes = this->_usednodes + -1;
    Rehash(this,false);
  }
  return;
}

Assistant:

void SQTable::Remove(const SQObjectPtr &key)
{

    _HashNode *n = _Get(key, HashObj(key) & (_numofnodes - 1));
    if (n) {
        n->val.Null();
        n->key.Null();
        _usednodes--;
        Rehash(false);
    }
}